

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

PrimitiveClass deqp::gls::getDrawPrimitiveClass(Primitive primitiveType)

{
  Primitive primitiveType_local;
  
  if (primitiveType == PRIMITIVE_POINTS) {
    return PRIMITIVECLASS_POINT;
  }
  if (2 < primitiveType - PRIMITIVE_TRIANGLES) {
    if (primitiveType - PRIMITIVE_LINES < 5) {
      return PRIMITIVECLASS_LINE;
    }
    if (1 < primitiveType - PRIMITIVE_TRIANGLES_ADJACENCY) {
      return PRIMITIVECLASS_LAST;
    }
  }
  return PRIMITIVECLASS_TRIANGLE;
}

Assistant:

static PrimitiveClass getDrawPrimitiveClass (gls::DrawTestSpec::Primitive primitiveType)
{
	switch (primitiveType)
	{
		case gls::DrawTestSpec::PRIMITIVE_POINTS:
			return PRIMITIVECLASS_POINT;

		case gls::DrawTestSpec::PRIMITIVE_LINES:
		case gls::DrawTestSpec::PRIMITIVE_LINE_STRIP:
		case gls::DrawTestSpec::PRIMITIVE_LINE_LOOP:
		case gls::DrawTestSpec::PRIMITIVE_LINES_ADJACENCY:
		case gls::DrawTestSpec::PRIMITIVE_LINE_STRIP_ADJACENCY:
			return PRIMITIVECLASS_LINE;

		case gls::DrawTestSpec::PRIMITIVE_TRIANGLES:
		case gls::DrawTestSpec::PRIMITIVE_TRIANGLE_FAN:
		case gls::DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP:
		case gls::DrawTestSpec::PRIMITIVE_TRIANGLES_ADJACENCY:
		case gls::DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP_ADJACENCY:
			return PRIMITIVECLASS_TRIANGLE;

		default:
			DE_ASSERT(false);
			return PRIMITIVECLASS_LAST;
	}
}